

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Vector<String> * __thiscall
dxil_spv::Converter::get_entry_points_abi_cxx11_
          (Vector<String> *__return_storage_ptr__,Converter *this,LLVMBCParser *parser)

{
  bool bVar1;
  Module *this_00;
  NamedMDNode *this_01;
  uint in_ECX;
  String local_90;
  MDOperand *local_70;
  MDOperand *func_node;
  MDNode *node;
  uint local_58;
  uint i;
  uint num_entry_points;
  NamedMDNode *local_30;
  NamedMDNode *ep_meta;
  Module *module;
  Converter *local_18;
  LLVMBCParser *parser_local;
  Vector<String> *result;
  
  module._7_1_ = 0;
  local_18 = this;
  parser_local = (LLVMBCParser *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = LLVMBCParser::get_module((LLVMBCParser *)local_18);
  ep_meta = (NamedMDNode *)this_00;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               &num_entry_points,"dx.entryPoints",(ThreadLocalAllocator<char> *)((long)&i + 3));
  this_01 = LLVMBC::Module::getNamedMetadata(this_00,(String *)&num_entry_points);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *
                )&num_entry_points);
  local_30 = this_01;
  local_58 = LLVMBC::NamedMDNode::getNumOperands(this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,(ulong)local_58);
  for (node._4_4_ = 0; node._4_4_ < local_58; node._4_4_ = node._4_4_ + 1) {
    func_node = &LLVMBC::NamedMDNode::getOperand(local_30,node._4_4_)->super_MDOperand;
    if ((MDNode *)func_node != (MDNode *)0x0) {
      local_70 = LLVMBC::MDNode::getOperand((MDNode *)func_node,0);
      bVar1 = LLVMBC::MDOperand::operator_cast_to_bool(local_70);
      if (bVar1) {
        get_string_metadata_abi_cxx11_(&local_90,(dxil_spv *)func_node,(MDNode *)0x1,in_ECX);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_90);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string(&local_90);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<String> Converter::get_entry_points(const LLVMBCParser &parser)
{
	Vector<String> result;
	auto &module = parser.get_module();
	auto *ep_meta = module.getNamedMetadata("dx.entryPoints");

	unsigned num_entry_points = ep_meta->getNumOperands();
	result.reserve(num_entry_points);

	for (unsigned i = 0; i < num_entry_points; i++)
	{
		auto *node = ep_meta->getOperand(i);
		if (node)
		{
			auto &func_node = node->getOperand(0);
			if (func_node)
				result.push_back(get_string_metadata(node, 1));
		}
	}

	return result;
}